

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BasicTexSubImage3DCase::createTexture(BasicTexSubImage3DCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *format;
  Vec4 *pVVar1;
  TextureFormatInfo *pTVar2;
  deUint32 dVar3;
  int height;
  int depth;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int max;
  int iVar8;
  deUint32 tex;
  TransferFormat local_e8;
  int local_dc;
  int local_d8;
  int local_d4;
  ulong local_d0;
  ContextWrapper *local_c8;
  Vec4 *local_c0;
  TextureFormatInfo *local_b8;
  Vec4 gMax;
  Vec4 gMin;
  Random rnd;
  TextureLevel data;
  PixelBufferAccess local_58;
  
  tex = 0;
  format = &(this->super_Texture3DSpecCase).m_texFormat;
  tcu::TextureLevel::TextureLevel(&data,format);
  dVar3 = deStringHash((this->super_Texture3DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  local_e8 = glu::getTransferFormat(*format);
  this_00 = &(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x806f,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_d0 = (ulong)local_e8 >> 0x20;
  local_b8 = &(this->super_Texture3DSpecCase).m_texFormatInfo;
  local_c0 = &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMax;
  iVar6 = 0;
  local_c8 = this_00;
  while( true ) {
    pTVar2 = local_b8;
    pVVar1 = local_c0;
    iVar5 = (this->super_Texture3DSpecCase).m_numLevels;
    if (iVar5 <= iVar6) break;
    bVar4 = (byte)iVar6;
    iVar5 = (this->super_Texture3DSpecCase).m_width >> (bVar4 & 0x1f);
    if (iVar5 < 2) {
      iVar5 = 1;
    }
    iVar7 = (this->super_Texture3DSpecCase).m_height >> (bVar4 & 0x1f);
    if (iVar7 < 2) {
      iVar7 = 1;
    }
    iVar8 = (this->super_Texture3DSpecCase).m_depth >> (bVar4 & 0x1f);
    if (iVar8 < 2) {
      iVar8 = 1;
    }
    randomVector<4>((Functional *)&gMin,&rnd,&local_b8->valueMin,local_c0);
    randomVector<4>((Functional *)&gMax,&rnd,&pTVar2->valueMin,pVVar1);
    tcu::TextureLevel::setSize(&data,iVar5,iVar7,iVar8);
    tcu::TextureLevel::getAccess(&local_58,&data);
    tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
    dVar3 = this->m_internalFormat;
    tcu::TextureLevel::getAccess(&local_58,&data);
    sglr::ContextWrapper::glTexImage3D
              (local_c8,0x806f,iVar6,dVar3,iVar5,iVar7,iVar8,0,local_e8.format,(deUint32)local_d0,
               local_58.super_ConstPixelBufferAccess.m_data);
    iVar6 = iVar6 + 1;
  }
  for (iVar6 = 0; iVar6 < iVar5; iVar6 = iVar6 + 1) {
    bVar4 = (byte)iVar6;
    iVar5 = (this->super_Texture3DSpecCase).m_width >> (bVar4 & 0x1f);
    iVar7 = 1;
    if (iVar5 < 2) {
      iVar5 = iVar7;
    }
    iVar8 = (this->super_Texture3DSpecCase).m_height >> (bVar4 & 0x1f);
    if (iVar8 < 2) {
      iVar8 = iVar7;
    }
    max = (this->super_Texture3DSpecCase).m_depth >> (bVar4 & 0x1f);
    if (max < 2) {
      max = iVar7;
    }
    local_d4 = iVar6;
    iVar7 = de::Random::getInt((Random *)&rnd.m_rnd,1,iVar5);
    height = de::Random::getInt((Random *)&rnd.m_rnd,1,iVar8);
    depth = de::Random::getInt((Random *)&rnd.m_rnd,1,max);
    local_d8 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar5 - iVar7);
    local_dc = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar8 - height);
    iVar5 = de::Random::getInt((Random *)&rnd.m_rnd,0,max - depth);
    pTVar2 = local_b8;
    pVVar1 = local_c0;
    randomVector<4>((Functional *)&gMin,(Random *)&rnd.m_rnd,&local_b8->valueMin,local_c0);
    randomVector<4>((Functional *)&gMax,(Random *)&rnd.m_rnd,&pTVar2->valueMin,pVVar1);
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    tcu::TextureLevel::setSize(&data,iVar7,height,depth);
    tcu::TextureLevel::getAccess(&local_58,&data);
    tcu::fillWithGrid(&local_58,dVar3 % 0xf + 2,&gMin,&gMax);
    tcu::TextureLevel::getAccess(&local_58,&data);
    iVar6 = local_d4;
    sglr::ContextWrapper::glTexSubImage3D
              (local_c8,0x806f,local_d4,local_d8,local_dc,iVar5,iVar7,height,depth,local_e8.format,
               (deUint32)local_d0,local_58.super_ConstPixelBufferAccess.m_data);
    iVar5 = (this->super_Texture3DSpecCase).m_numLevels;
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32				tex				= 0;
		tcu::TextureLevel		data			(m_texFormat);
		de::Random				rnd				(deStringHash(getName()));
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_3D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		levelD		= de::max(1, m_depth >> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			data.setSize(levelW, levelH, levelD);
			tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_3D, ndx, m_internalFormat, levelW, levelH, levelD, 0, transferFmt.format, transferFmt.dataType, data.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		levelD		= de::max(1, m_depth >> ndx);

			int		w			= rnd.getInt(1, levelW);
			int		h			= rnd.getInt(1, levelH);
			int		d			= rnd.getInt(1, levelD);
			int		x			= rnd.getInt(0, levelW-w);
			int		y			= rnd.getInt(0, levelH-h);
			int		z			= rnd.getInt(0, levelD-d);

			Vec4	colorA		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	colorB		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			int		cellSize	= rnd.getInt(2, 16);

			data.setSize(w, h, d);
			tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);

			glTexSubImage3D(GL_TEXTURE_3D, ndx, x, y, z, w, h, d, transferFmt.format, transferFmt.dataType, data.getAccess().getDataPtr());
		}
	}